

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  undefined1 *local_f0;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  string shader_source;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_38;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  size_t num_var_types;
  test_var_type *var_types_set;
  TestShaderType tested_shader_type_local;
  InteractionStorageBuffers1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x3 < var_iterator._M_node) {
      return;
    }
    local_40._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                test_shader_compilation::var_types_set_gl + (long)var_iterator._M_node);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_38,&local_40);
    shader_source.field_2._8_8_ =
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_48,(iterator *)((long)&shader_source.field_2 + 8));
    bVar1 = std::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)local_70);
    std::__cxx11::string::operator+=((string *)local_70,"buffer uBlocka {\n");
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
             ::operator->(&local_38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,"    ",
                   &(ppVar2->second).type);
    std::operator+(&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   " x[1][1][1][1][1][1];\n");
    std::__cxx11::string::operator+=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&cs);
    std::__cxx11::string::operator+=((string *)local_70,"};\n\n");
    std::__cxx11::string::operator+=((string *)local_70,(string *)shader_start_abi_cxx11_);
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_70,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_70,(string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=((string *)local_70,(string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1cab);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_70,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_f0 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      local_f0 = local_70;
      break;
    case VERTEX_SHADER_TYPE:
      tcs = (string *)local_70;
      break;
    case COMPUTE_SHADER_TYPE:
      vs = (string *)local_70;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_f0 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      fs = (string *)local_70;
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      tes = (string *)local_70;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      gs = (string *)local_70;
      break;
    default:
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1cae);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_f0,vs,1,0);
    std::__cxx11::string::~string((string *)local_70);
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1cb2);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InteractionStorageBuffers1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source;

			shader_source += "buffer uBlocka {\n";
			shader_source += "    " + var_iterator->second.type + " x[1][1][1][1][1][1];\n";
			shader_source += "};\n\n";
			shader_source += shader_start;

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}